

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_loadu64(ASMState *as,Reg r,uint64_t u64)

{
  long lVar1;
  int iVar2;
  ASMState *in_RDX;
  uint in_ESI;
  long in_RDI;
  MCode *p_1;
  MCode *p;
  uint32_t rex;
  int n;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 local_18;
  
  if (in_RDX == (ASMState *)((ulong)in_RDX & 0xffffffff)) {
    emit_loadi(in_RDX,(Reg)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               (int32_t)in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == (ASMState *)(long)(int)in_RDX) {
    lVar1 = *(long *)(in_RDI + 0x80);
    *(int *)(lVar1 + -4) = (int)in_RDX;
    *(byte *)(lVar1 + -5) = ((byte)in_ESI & 7) - 0x40;
    *(undefined4 *)(lVar1 + -9) = 0xc70000fe;
    local_18 = lVar1 + -6;
    iVar2 = (in_ESI >> 3 & 1) + 0x140;
    if (iVar2 != 0x40) {
      local_18 = lVar1 + -7;
      *(byte *)(lVar1 + -7) = (byte)iVar2 | 8;
    }
    *(long *)(in_RDI + 0x80) = local_18;
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x80);
    *(ASMState **)(lVar1 + -8) = in_RDX;
    *(byte *)(lVar1 + -9) = ((byte)in_ESI & 7) + 0xb8;
    *(byte *)(lVar1 + -10) = ((byte)(in_ESI >> 3) & 1) + 0x48;
    *(long *)(in_RDI + 0x80) = lVar1 + -10;
  }
  return;
}

Assistant:

static void emit_loadu64(ASMState *as, Reg r, uint64_t u64)
{
  if (checku32(u64)) {  /* 32 bit load clears upper 32 bits. */
    emit_loadi(as, r, (int32_t)u64);
  } else if (checki32((int64_t)u64)) {  /* Sign-extended 32 bit load. */
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = (int32_t)u64;
    as->mcp = emit_opm(XO_MOVmi, XM_REG, REX_64, r, p, -4);
  } else {  /* Full-size 64 bit load. */
    MCode *p = as->mcp;
    *(uint64_t *)(p-8) = u64;
    p[-9] = (MCode)(XI_MOVri+(r&7));
    p[-10] = 0x48 + ((r>>3)&1);
    p -= 10;
    as->mcp = p;
  }
}